

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

int Cec_GiaSplitTest2(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose,
                     int fVeryVerbose,int fSilent)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Aig_Man_t *pAVar7;
  Cnf_Dat_t *pCVar8;
  uint *puVar9;
  undefined8 *puVar10;
  Gia_Man_t *pGVar11;
  Gia_Man_t *pGVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  void *pvVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  double dVar23;
  int nSatConfs;
  timespec ts;
  int Cost;
  int nFanouts;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  uint local_94;
  void *local_90;
  int local_88;
  int local_84;
  timespec local_80;
  double local_70;
  long local_68;
  ulong local_60;
  Gia_Man_t *local_58;
  uint *local_50;
  ulong local_48;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  
  local_88 = nTimeOut;
  local_84 = fVerbose;
  local_58 = p;
  local_40 = nIterMax;
  local_3c = LookAhead;
  iVar3 = clock_gettime(3,&local_80);
  pGVar11 = local_58;
  if (iVar3 < 0) {
    local_68 = -1;
  }
  else {
    local_68 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  pAVar7 = Gia_ManToAigSimple(local_58);
  pAVar7->nRegs = 0;
  pCVar8 = Cnf_Derive(pAVar7,0);
  Aig_ManStop(pAVar7);
  iVar4 = Cnf_GiaSolveOne(pGVar11,pCVar8,local_88,&local_98,&local_9c);
  Cnf_DataFree(pCVar8);
  iVar17 = local_98;
  iVar3 = local_9c;
  if (local_84 != 0) {
    iVar5 = clock_gettime(3,&local_80);
    if (iVar5 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    Cec_GiaSplitPrint(0,0,iVar17,iVar3,iVar4,0.0,lVar18 - local_68);
  }
  if (iVar4 == -1) {
    puVar9 = (uint *)malloc(0x10);
    puVar9[0] = 1000;
    puVar9[1] = 0;
    puVar10 = (undefined8 *)malloc(8000);
    *(undefined8 **)(puVar9 + 2) = puVar10;
    pGVar11 = Gia_ManDup(local_58);
    puVar9[1] = 1;
    *puVar10 = pGVar11;
    pvVar15 = *(void **)(puVar9 + 2);
    local_a4 = -1;
    local_70 = 0.0;
    uVar21 = 1;
    uVar16 = 1;
    local_50 = puVar9;
    do {
      local_48 = (ulong)((int)uVar16 - 1);
      pGVar11 = *(Gia_Man_t **)((long)pvVar15 + local_48 * 8);
      local_a0 = 1;
      if (pGVar11->vCofVars != (Vec_Int_t *)0x0) {
        local_a0 = pGVar11->vCofVars->nSize + 1;
      }
      local_90 = pvVar15;
      local_60 = uVar16;
      uVar6 = Gia_SplitCofVar(pGVar11,local_3c,(int *)&local_34,(int *)&local_38);
      pGVar12 = Gia_ManDupCofactorVar(pGVar11,uVar6,0);
      if (pGVar11->vCofVars == (Vec_Int_t *)0x0) {
        pVVar13 = (Vec_Int_t *)malloc(0x10);
        pVVar13->nCap = 100;
        pVVar13->nSize = 0;
        piVar14 = (int *)malloc(400);
        pVVar13->pArray = piVar14;
        pGVar11->vCofVars = pVVar13;
      }
      local_94 = uVar21;
      if (fVeryVerbose != 0) {
        printf("Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n",
               (ulong)uVar6,(ulong)local_34,(ulong)local_38,
               (ulong)(uint)(~(pGVar11->vCos->nSize + pGVar11->vCis->nSize) + pGVar11->nObjs),
               (ulong)(uint)(~(pGVar12->vCos->nSize + pGVar12->vCis->nSize) + pGVar12->nObjs));
      }
      uVar21 = pGVar11->vCofVars->nSize;
      iVar3 = uVar21 + 1;
      pVVar13 = (Vec_Int_t *)malloc(0x10);
      if (uVar21 < 0xf) {
        iVar3 = 0x10;
      }
      pVVar13->nSize = 0;
      pVVar13->nCap = iVar3;
      if (iVar3 == 0) {
        piVar14 = (int *)0x0;
      }
      else {
        piVar14 = (int *)malloc((long)iVar3 << 2);
      }
      pVVar13->pArray = piVar14;
      pGVar12->vCofVars = pVVar13;
      pVVar1 = pGVar11->vCofVars;
      if (0 < pVVar1->nSize) {
        lVar18 = 0;
        do {
          Vec_IntPush(pVVar13,pVVar1->pArray[lVar18]);
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar1->nSize);
      }
      Vec_IntPush(pGVar12->vCofVars,uVar6 * 2 + 1);
      pAVar7 = Gia_ManToAigSimple(pGVar12);
      pAVar7->nRegs = 0;
      pCVar8 = Cnf_Derive(pAVar7,0);
      Aig_ManStop(pAVar7);
      iVar3 = Cnf_GiaSolveOne(pGVar12,pCVar8,local_88,&local_98,&local_9c);
      Cnf_DataFree(pCVar8);
      if (iVar3 == 1) {
        dVar23 = ldexp(1.0,local_a0);
        local_70 = local_70 + 1.0 / dVar23;
      }
      iVar4 = local_98;
      iVar17 = local_9c;
      if (local_84 != 0) {
        iVar5 = clock_gettime(3,&local_80);
        if (iVar5 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
        }
        Cec_GiaSplitPrint(local_94,local_a0,iVar4,iVar17,iVar3,local_70,lVar18 - local_68);
      }
      puVar9 = local_50;
      if (iVar3 == 0) {
        local_58->pCexComb = pGVar12->pCexComb;
        pGVar12->pCexComb = (Abc_Cex_t *)0x0;
        Gia_ManStop(pGVar11);
        Gia_ManStop(pGVar12);
        uVar16 = local_48;
        puVar9 = local_50;
        uVar21 = local_94;
LAB_005d3c93:
        local_a4 = 0;
        bVar2 = false;
        pvVar15 = local_90;
      }
      else {
        if (iVar3 == 1) {
          Gia_ManStop(pGVar12);
          local_60 = local_48;
        }
        else {
          uVar21 = *local_50;
          uVar19 = (uint)local_48;
          if (uVar19 == uVar21) {
            if ((int)uVar21 < 0x10) {
              if (local_90 == (void *)0x0) {
                local_90 = malloc(0x80);
              }
              else {
                local_90 = realloc(local_90,0x80);
              }
              uVar20 = 0x10;
            }
            else {
              uVar20 = uVar21 * 2;
              if ((int)uVar20 <= (int)uVar21) goto LAB_005d3a87;
              if (local_90 == (void *)0x0) {
                local_90 = malloc((ulong)uVar21 << 4);
              }
              else {
                local_90 = realloc(local_90,(ulong)uVar21 << 4);
              }
            }
            *puVar9 = uVar20;
          }
LAB_005d3a87:
          *(Gia_Man_t **)((long)local_90 + (long)(int)uVar19 * 8) = pGVar12;
        }
        pGVar12 = Gia_ManDupCofactorVar(pGVar11,uVar6,1);
        uVar21 = pGVar11->vCofVars->nSize;
        iVar3 = uVar21 + 1;
        pVVar13 = (Vec_Int_t *)malloc(0x10);
        if (uVar21 < 0xf) {
          iVar3 = 0x10;
        }
        pVVar13->nSize = 0;
        pVVar13->nCap = iVar3;
        if (iVar3 == 0) {
          piVar14 = (int *)0x0;
        }
        else {
          piVar14 = (int *)malloc((long)iVar3 << 2);
        }
        pVVar13->pArray = piVar14;
        pGVar12->vCofVars = pVVar13;
        pVVar1 = pGVar11->vCofVars;
        if (0 < pVVar1->nSize) {
          lVar18 = 0;
          do {
            Vec_IntPush(pVVar13,pVVar1->pArray[lVar18]);
            lVar18 = lVar18 + 1;
          } while (lVar18 < pVVar1->nSize);
        }
        Vec_IntPush(pGVar12->vCofVars,uVar6 * 2);
        Gia_ManStop(pGVar11);
        pAVar7 = Gia_ManToAigSimple(pGVar12);
        pAVar7->nRegs = 0;
        pCVar8 = Cnf_Derive(pAVar7,0);
        Aig_ManStop(pAVar7);
        iVar3 = Cnf_GiaSolveOne(pGVar12,pCVar8,local_88,&local_98,&local_9c);
        Cnf_DataFree(pCVar8);
        if (iVar3 == 1) {
          dVar23 = ldexp(1.0,local_a0);
          local_70 = local_70 + 1.0 / dVar23;
        }
        puVar9 = local_50;
        uVar21 = local_94;
        iVar4 = local_98;
        iVar17 = local_9c;
        if (local_84 != 0) {
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          Cec_GiaSplitPrint(uVar21,local_a0,iVar4,iVar17,iVar3,local_70,lVar18 - local_68);
        }
        if (iVar3 == 0) {
          local_58->pCexComb = pGVar12->pCexComb;
          pGVar12->pCexComb = (Abc_Cex_t *)0x0;
          Gia_ManStop(pGVar12);
          uVar16 = local_60;
          goto LAB_005d3c93;
        }
        if (iVar3 == 1) {
          Gia_ManStop(pGVar12);
          uVar16 = local_60;
          pvVar15 = local_90;
        }
        else {
          uVar6 = *puVar9;
          pvVar15 = local_90;
          if ((uint)local_60 == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (local_90 == (void *)0x0) {
                pvVar15 = malloc(0x80);
              }
              else {
                pvVar15 = realloc(local_90,0x80);
              }
              uVar19 = 0x10;
            }
            else {
              uVar19 = uVar6 * 2;
              if ((int)uVar19 <= (int)uVar6) goto LAB_005d3d08;
              if (local_90 == (void *)0x0) {
                pvVar15 = malloc((ulong)uVar6 << 4);
              }
              else {
                pvVar15 = realloc(local_90,(ulong)uVar6 << 4);
              }
            }
            *puVar9 = uVar19;
          }
LAB_005d3d08:
          uVar16 = (ulong)((int)local_60 + 1);
          *(Gia_Man_t **)((long)pvVar15 + (long)(int)local_60 * 8) = pGVar12;
        }
        bVar2 = (int)uVar21 < local_40 || local_40 == 0;
      }
      uVar6 = (uint)uVar16;
    } while ((bVar2) && (uVar21 = uVar21 + 1, 0 < (int)uVar6));
    *(void **)(puVar9 + 2) = pvVar15;
    puVar9[1] = uVar6;
    if (uVar6 == 0) {
      local_a4 = 1;
    }
    if (0 < (int)uVar6) {
      lVar18 = *(long *)(puVar9 + 2);
      uVar22 = 0;
      do {
        Gia_ManStop(*(Gia_Man_t **)(lVar18 + uVar22 * 8));
        uVar22 = uVar22 + 1;
      } while ((uVar16 & 0xffffffff) != uVar22);
    }
    if (*(void **)(puVar9 + 2) != (void *)0x0) {
      free(*(void **)(puVar9 + 2));
      puVar9[2] = 0;
      puVar9[3] = 0;
    }
    free(puVar9);
    if (fSilent == 0) {
      printf((&PTR_anon_var_dwarf_6aa8c0_00a96ca0)[local_a4]);
      printf("after %d case-splits.  ",(ulong)uVar21);
      iVar17 = 3;
      iVar3 = clock_gettime(3,&local_80);
      if (iVar3 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
      lVar18 = lVar18 - local_68;
      Abc_Print(iVar17,"%s =","Time");
      Abc_Print(iVar17,"%9.2f sec\n",(double)lVar18 / 1000000.0);
      fflush(_stdout);
    }
  }
  else if (iVar4 == 1) {
    local_a4 = 1;
    if (fSilent == 0) {
      puts("The problem is UNSAT without cofactoring.");
      local_a4 = 1;
    }
  }
  else {
    local_a4 = 0;
    if (fSilent == 0) {
      puts("The problem is SAT without cofactoring.");
      local_a4 = 0;
    }
  }
  return local_a4;
}

Assistant:

int Cec_GiaSplitTest2( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    abctime clkTotal = Abc_Clock();
    Vec_Ptr_t * vStack;
    Cnf_Dat_t * pCnf;
    int nSatVars, nSatConfs;
    int nIter, status, RetValue = -1;
    double Progress = 0;
    // check the problem
    pCnf = Cec_GiaDeriveGiaRemapped( p );
    status = Cnf_GiaSolveOne( p, pCnf, nTimeOut, &nSatVars, &nSatConfs );
    Cnf_DataFree( pCnf );
    if ( fVerbose )
        Cec_GiaSplitPrint( 0, 0, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
    if ( status == 0 )
    {
		if ( !fSilent )
        printf( "The problem is SAT without cofactoring.\n" );
        return 0;
    }
    if ( status == 1 )
    {
		if ( !fSilent )
        printf( "The problem is UNSAT without cofactoring.\n" );
        return 1;
    }
    assert( status == -1 );
    // create local copy
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( vStack, Gia_ManDup(p) );
    // start with the current problem
    for ( nIter = 1; Vec_PtrSize(vStack) > 0; nIter++ )
    {
        // get the last AIG
        Gia_Man_t * pLast = (Gia_Man_t *)Vec_PtrPop( vStack );
        // determine cofactoring variable
        int Depth = 1 + (pLast->vCofVars ? Vec_IntSize(pLast->vCofVars) : 0);
        int nFanouts, Cost, iVar  = Gia_SplitCofVar( pLast, LookAhead, &nFanouts, &Cost );
        // cofactor
        Gia_Man_t * pPart = Gia_ManDupCofactorVar( pLast, iVar, 0 );
        if ( pLast->vCofVars == NULL )
            pLast->vCofVars = Vec_IntAlloc( 100 );
        // print results
        if ( fVeryVerbose )
        {
//            Cec_GiaSplitPrintRefs( pLast );
            printf( "Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n", 
                iVar, nFanouts, Cost, Gia_ManAndNum(pLast), Gia_ManAndNum(pPart) );
//            Cec_GiaSplitPrintRefs( pPart );
        }
        // create variable
        pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
        Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
        Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
        // solve the problem
        pCnf = Cec_GiaDeriveGiaRemapped( pPart );
        status = Cnf_GiaSolveOne( pPart, pCnf, nTimeOut, &nSatVars, &nSatConfs );
        Cnf_DataFree( pCnf );
        if ( status == 1 )
            Progress += 1.0 / pow(2, Depth);
        if ( fVerbose ) 
            Cec_GiaSplitPrint( nIter, Depth, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
        if ( status == 0 ) // SAT
        {
            p->pCexComb = pPart->pCexComb;  pPart->pCexComb = NULL;
            Gia_ManStop( pLast );
            Gia_ManStop( pPart );
            RetValue = 0;
            break;
        }
        if ( status == 1 ) // UNSAT
            Gia_ManStop( pPart );
        else               // UNDEC
            Vec_PtrPush( vStack, pPart );
        // cofactor
        pPart = Gia_ManDupCofactorVar( pLast, iVar, 1 );
        // create variable
        pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
        Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
        Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 0) );
        Gia_ManStop( pLast );
        // solve the problem
        pCnf = Cec_GiaDeriveGiaRemapped( pPart );
        status = Cnf_GiaSolveOne( pPart, pCnf, nTimeOut, &nSatVars, &nSatConfs );
        Cnf_DataFree( pCnf );
        if ( status == 1 )
            Progress += 1.0 / pow(2, Depth);
        if ( fVerbose )
            Cec_GiaSplitPrint( nIter, Depth, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
        if ( status == 0 ) // SAT
        {
            p->pCexComb = pPart->pCexComb;  pPart->pCexComb = NULL;
            Gia_ManStop( pPart );
            RetValue = 0;
            break;
        }
        if ( status == 1 ) // UNSAT
            Gia_ManStop( pPart );
        else               // UNDEC
            Vec_PtrPush( vStack, pPart );
        if ( nIterMax && nIter >= nIterMax )
            break;
    }
    if ( Vec_PtrSize(vStack) == 0 )
        RetValue = 1;
    // finish
    Cec_GiaSplitClean( vStack );
	if ( !fSilent )
	{
		if ( RetValue == 0 )
			printf( "Problem is SAT " );
		else if ( RetValue == 1 )
			printf( "Problem is UNSAT " );
		else if ( RetValue == -1 )
			printf( "Problem is UNDECIDED " );
		else assert( 0 );
		printf( "after %d case-splits.  ", nIter );
		Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
		fflush( stdout );
	}
    return RetValue;
}